

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_binary.c
# Opt level: O3

archive_string_conv * get_sconv(archive_write *a)

{
  void *pvVar1;
  archive_string_conv *paVar2;
  
  pvVar1 = a->format_data;
  paVar2 = *(archive_string_conv **)((long)pvVar1 + 0x28);
  if (paVar2 == (archive_string_conv *)0x0) {
    if (*(int *)((long)pvVar1 + 0x38) == 0) {
      paVar2 = archive_string_default_conversion_for_write(&a->archive);
      *(archive_string_conv **)((long)pvVar1 + 0x30) = paVar2;
      *(undefined4 *)((long)pvVar1 + 0x38) = 1;
    }
    else {
      paVar2 = *(archive_string_conv **)((long)pvVar1 + 0x30);
    }
  }
  return paVar2;
}

Assistant:

static struct archive_string_conv *
get_sconv(struct archive_write *a)
{
	struct cpio *cpio;
	struct archive_string_conv *sconv;

	cpio = (struct cpio *)a->format_data;
	sconv = cpio->opt_sconv;
	if (sconv == NULL) {
		if (!cpio->init_default_conversion) {
			cpio->sconv_default =
			    archive_string_default_conversion_for_write(
			      &(a->archive));
			cpio->init_default_conversion = 1;
		}
		sconv = cpio->sconv_default;
	}
	return (sconv);
}